

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjTryInteger(jx9_value *pObj)

{
  jx9_value *pObj_local;
  
  if ((pObj->iFlags & 4U) != 0) {
    MemObjTryIntger(pObj);
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjTryInteger(jx9_value *pObj)
{
	if( pObj->iFlags & MEMOBJ_REAL ){
		/* Work only with reals */
		MemObjTryIntger(&(*pObj));
	}
	return SXRET_OK;
}